

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O1

Error __thiscall asmjit::VMemMgr::release(VMemMgr *this,void *p)

{
  uint8_t *puVar1;
  RbNode *pRVar2;
  uint8_t *puVar3;
  pthread_mutex_t *ppVar4;
  long lVar5;
  size_t *psVar6;
  RbNode *pRVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  Error EVar13;
  ulong uVar14;
  pthread_mutex_t *ppVar15;
  ulong uVar16;
  ulong uVar17;
  pthread_mutex_t *ppVar18;
  pthread_mutex_t *ppVar19;
  RbNode *pRVar20;
  ulong uVar21;
  ulong *puVar22;
  long extraout_RDX;
  ulong *puVar23;
  RbNode *root;
  undefined8 *puVar24;
  long lVar25;
  RbNode *pRVar26;
  RbNode *pRVar27;
  ulong uVar28;
  RbNode *save;
  asmjit *paVar29;
  pthread_mutex_t *ppVar30;
  pthread_mutex_t *ppVar31;
  bool bVar32;
  undefined1 local_58 [40];
  
  if (p == (void *)0x0) {
    return 0;
  }
  pthread_mutex_lock((pthread_mutex_t *)this);
  ppVar31 = (pthread_mutex_t *)this->_root;
  do {
    if (ppVar31 == (pthread_mutex_t *)0x0) {
      ppVar31 = (pthread_mutex_t *)0x0;
      break;
    }
    if (p < *(uint8_t **)&(ppVar31->__data).__kind) {
LAB_001187e3:
      ppVar31 = (pthread_mutex_t *)ppVar31->__align;
      bVar32 = true;
    }
    else {
      if (*(uint8_t **)&(ppVar31->__data).__kind + *(long *)((long)ppVar31 + 0x30) <= p) {
        ppVar31 = (pthread_mutex_t *)&(ppVar31->__data).__owner;
        goto LAB_001187e3;
      }
      bVar32 = false;
    }
  } while (bVar32);
  if (ppVar31 != (pthread_mutex_t *)0x0) {
    puVar1 = *(uint8_t **)&(ppVar31->__data).__kind;
    lVar25 = 0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *(ulong *)((long)ppVar31 + 0x48);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (long)p - (long)puVar1;
    uVar21 = SUB168(auVar10 / auVar8,0) >> 3 & 0xfffffffffffffff8;
    puVar23 = (ulong *)(*(long *)((long)ppVar31 + 0x58) + uVar21);
    puVar22 = (ulong *)(uVar21 + *(long *)((long)ppVar31 + 0x60));
    uVar21 = 1L << (SUB161(auVar10 / auVar8,0) & 0x3f);
    do {
      uVar14 = *puVar23;
      uVar17 = *puVar22;
      do {
        uVar28 = uVar21;
        uVar16 = uVar17;
        uVar14 = uVar14 & ~uVar28;
        uVar17 = ~uVar28 & uVar16;
        lVar25 = lVar25 + 1;
        if ((uVar28 & uVar16) == 0) break;
        uVar21 = uVar28 * 2;
      } while (uVar28 * 2 != 0);
      *puVar23 = uVar14;
      *puVar22 = uVar17;
      if ((uVar28 & uVar16) == 0) goto LAB_0011887c;
      puVar23 = puVar23 + 1;
      puVar22 = puVar22 + 1;
      uVar21 = 1;
    } while( true );
  }
  EVar13 = 3;
  goto LAB_00118bab;
LAB_00118cd3:
  uVar14 = ~uVar17 & uVar14;
  uVar17 = uVar17 * 2;
  if ((bool)(uVar17 == 0 | bVar32)) {
    *puVar23 = uVar16;
    *puVar22 = uVar14;
    if (bVar32) goto LAB_00118d25;
    uVar16 = puVar23[1];
    puVar23 = puVar23 + 1;
    uVar14 = puVar22[1];
    puVar22 = puVar22 + 1;
    uVar17 = 1;
  }
  bVar32 = (uVar17 & uVar14) == 0;
  uVar16 = uVar16 & ~uVar17;
  lVar25 = lVar25 + 1;
  goto LAB_00118cd3;
LAB_00118d25:
  uVar21 = lVar25 * puVar24[9];
  if ((ulong)puVar24[10] < uVar21) {
    puVar24[10] = uVar21;
  }
  puVar24[7] = puVar24[7] - uVar21;
  *(long *)((long)ppVar18 + 0x48) = *(long *)((long)ppVar18 + 0x48) - uVar21;
  EVar13 = 0;
  goto LAB_00118d3f;
LAB_0011887c:
  root = *(RbNode **)((long)ppVar31 + 0x30);
  pRVar2 = *(RbNode **)((long)ppVar31 + 0x38);
  if (pRVar2 == root) {
    ppVar18 = (pthread_mutex_t *)this->_optimal;
    do {
      ppVar18 = (pthread_mutex_t *)(ppVar18->__data).__list.__next;
      if (ppVar18 == ppVar31) {
        this->_optimal = (MemNode *)ppVar31;
        break;
      }
    } while (ppVar18 != (pthread_mutex_t *)0x0);
  }
  pRVar26 = (RbNode *)(lVar25 * *(long *)((long)ppVar31 + 0x48));
  if ((RbNode *)ppVar31[2].__align < pRVar26) {
    ppVar31[2].__align = (long)pRVar26;
  }
  *(long *)((long)ppVar31 + 0x38) = (long)pRVar2 - (long)pRVar26;
  this->_usedBytes = this->_usedBytes - (long)pRVar26;
  if (pRVar2 != pRVar26) {
LAB_00118ba9:
    EVar13 = 0;
LAB_00118bab:
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return EVar13;
  }
  OSUtils::releaseVirtualMemory(puVar1,(size_t)root);
  free(*(void **)((long)ppVar31 + 0x58));
  *(long *)((long)ppVar31 + 0x58) = 0;
  *(long *)((long)ppVar31 + 0x60) = 0;
  this->_allocatedBytes = this->_allocatedBytes - *(long *)((long)ppVar31 + 0x30);
  local_58._16_8_ = 0;
  local_58._24_8_ = (__pthread_internal_list *)0x0;
  local_58._0_8_ = 0;
  local_58._32_8_ = this;
  local_58._8_8_ = this->_root;
  if ((pthread_mutex_t *)local_58._8_8_ == (pthread_mutex_t *)0x0) {
    ppVar18 = (pthread_mutex_t *)local_58;
    ppVar19 = (pthread_mutex_t *)0x0;
    ppVar15 = (pthread_mutex_t *)0x0;
  }
  else {
    paVar29 = (asmjit *)(local_58 + 8);
    uVar14 = 1;
    ppVar19 = (pthread_mutex_t *)0x0;
    uVar21 = 1;
    ppVar4 = (pthread_mutex_t *)local_58._8_8_;
    ppVar18 = (pthread_mutex_t *)local_58;
    ppVar30 = (pthread_mutex_t *)0x0;
    do {
      ppVar15 = ppVar18;
      ppVar18 = ppVar4;
      puVar1 = *(uint8_t **)&(ppVar18->__data).__kind;
      puVar3 = *(uint8_t **)&(ppVar31->__data).__kind;
      if (ppVar18 == ppVar31) {
        ppVar19 = ppVar18;
      }
      if (*(uint32_t *)&(ppVar18->__data).__list.__prev == 0) {
        uVar17 = (ulong)(puVar1 < puVar3);
        root = *(RbNode **)((long)ppVar18 + uVar17 * 8);
        if ((root == (RbNode *)0x0) || (root->red == 0)) {
          root = (RbNode *)(ulong)(puVar3 <= puVar1);
          ppVar4 = *(pthread_mutex_t **)((long)ppVar18 + (long)root * 8);
          if ((ppVar4 == (pthread_mutex_t *)0x0) ||
             (*(uint32_t *)&(ppVar4->__data).__list.__prev == 0)) {
            uVar17 = (ulong)((uint)uVar21 ^ 1);
            lVar25 = *(long *)((long)ppVar15 + uVar17 * 8);
            if (lVar25 != 0) {
              root = *(RbNode **)(lVar25 + uVar17 * 8);
              if (((root == (RbNode *)0x0) || (root->red == 0)) &&
                 ((lVar5 = *(long *)(lVar25 + uVar14 * 8), lVar5 == 0 ||
                  (*(int *)(lVar5 + 0x18) == 0)))) {
                *(uint32_t *)&(ppVar15->__data).__list.__prev = 0;
                *(undefined4 *)(lVar25 + 0x18) = 1;
                *(uint32_t *)&(ppVar18->__data).__list.__prev = 1;
              }
              else {
                ppVar4 = *(pthread_mutex_t **)&(ppVar30->__data).__owner;
                lVar5 = *(long *)(lVar25 + uVar14 * 8);
                if ((lVar5 == 0) || (*(int *)(lVar5 + 0x18) == 0)) {
                  if ((root != (RbNode *)0x0) && (root->red != 0)) {
                    *(long *)((long)ppVar15 + uVar17 * 8) = lVar5;
                    *(pthread_mutex_t **)(lVar25 + uVar14 * 8) = ppVar15;
                    *(uint32_t *)&(ppVar15->__data).__list.__prev = 1;
                    goto LAB_00118a79;
                  }
                }
                else {
                  lVar5 = *(long *)(lVar25 + uVar21 * 8);
                  *(undefined8 *)(lVar25 + uVar21 * 8) = *(undefined8 *)(lVar5 + uVar17 * 8);
                  *(long *)(lVar5 + uVar17 * 8) = lVar25;
                  *(undefined4 *)(lVar25 + 0x18) = 1;
                  *(undefined4 *)(lVar5 + 0x18) = 0;
                  *(long *)((long)ppVar15 + uVar17 * 8) = lVar5;
                  *(long *)((long)ppVar15 + uVar17 * 8) = *(long *)(lVar5 + uVar14 * 8);
                  *(pthread_mutex_t **)(lVar5 + uVar14 * 8) = ppVar15;
                  *(uint32_t *)&(ppVar15->__data).__list.__prev = 1;
                  lVar25 = lVar5;
LAB_00118a79:
                  *(undefined4 *)(lVar25 + 0x18) = 0;
                  *(long *)((long)ppVar30 + (ulong)(ppVar4 == ppVar15) * 8) = lVar25;
                }
                psVar6 = *(size_t **)((long)ppVar30 + (ulong)(ppVar4 == ppVar15) * 8);
                *(undefined4 *)(psVar6 + 3) = 1;
                *(uint32_t *)&(ppVar18->__data).__list.__prev = 1;
                root = (RbNode *)*psVar6;
                root->red = 0;
                *(undefined4 *)(psVar6[1] + 0x18) = 0;
              }
            }
          }
          else {
            *(long *)((long)ppVar18 + (long)root * 8) = *(long *)((long)ppVar4 + uVar17 * 8);
            *(pthread_mutex_t **)((long)ppVar4 + uVar17 * 8) = ppVar18;
            *(uint32_t *)&(ppVar18->__data).__list.__prev = 1;
            *(uint32_t *)&(ppVar4->__data).__list.__prev = 0;
            *(pthread_mutex_t **)paVar29 = ppVar4;
            ppVar15 = ppVar4;
          }
        }
      }
      uVar21 = (ulong)(puVar1 < puVar3);
      uVar14 = (ulong)(puVar1 < puVar3);
      paVar29 = (asmjit *)((long)ppVar18 + uVar14 * 8);
      ppVar4 = *(pthread_mutex_t **)paVar29;
      ppVar30 = ppVar15;
    } while (*(pthread_mutex_t **)paVar29 != (pthread_mutex_t *)0x0);
  }
  this = (VMemMgr *)local_58._32_8_;
  if (ppVar19 == (pthread_mutex_t *)0x0) {
    release();
LAB_00118bc9:
    release();
LAB_00118bce:
    release();
  }
  else {
    if (ppVar19 == (pthread_mutex_t *)local_58) goto LAB_00118bc9;
    if (ppVar18 == (pthread_mutex_t *)local_58) goto LAB_00118bce;
    if (ppVar19 != ppVar18) {
      *(uint8_t **)&(ppVar19->__data).__kind = *(uint8_t **)&(ppVar18->__data).__kind;
      lVar25 = *(long *)((long)ppVar18 + 0x38);
      *(long *)((long)ppVar19 + 0x30) = *(long *)((long)ppVar18 + 0x30);
      *(long *)((long)ppVar19 + 0x38) = lVar25;
      lVar25 = *(long *)((long)ppVar18 + 0x48);
      *(long *)((long)ppVar19 + 0x40) = *(long *)((long)ppVar18 + 0x40);
      *(long *)((long)ppVar19 + 0x48) = lVar25;
      ppVar19[2].__align = ppVar18[2].__align;
      lVar25 = *(long *)((long)ppVar18 + 0x60);
      *(long *)((long)ppVar19 + 0x58) = *(long *)((long)ppVar18 + 0x58);
      *(long *)((long)ppVar19 + 0x60) = lVar25;
    }
    *(long *)((long)ppVar15 +
             (ulong)(*(pthread_mutex_t **)&(ppVar15->__data).__owner == ppVar18) * 8) =
         *(long *)((long)ppVar18 + (ulong)(ppVar18->__align == 0) * 8);
    ((pthread_mutex_t *)((long)this + 0x50))->__align = local_58._8_8_;
    if ((pthread_mutex_t *)local_58._8_8_ != (pthread_mutex_t *)0x0) {
      *(undefined4 *)(local_58._8_8_ + 0x18) = 0;
    }
    pRVar7 = (RbNode *)(ppVar18->__data).__list.__next;
    pRVar20 = (RbNode *)ppVar18[1].__align;
    root = (RbNode *)(pRVar7[1].node + 1);
    if (pRVar7 == (RbNode *)0x0) {
      root = (RbNode *)&(((pthread_mutex_t *)((long)this + 0x50))->__data).__owner;
    }
    pRVar27 = pRVar20 + 1;
    if (pRVar20 == (RbNode *)0x0) {
      pRVar27 = (RbNode *)((long)this + 0x60);
    }
    root->node[0] = pRVar20;
    pRVar27->node[0] = pRVar7;
    if ((pthread_mutex_t *)((__pthread_internal_list *)((long)this + 0x60))->__next == ppVar18) {
      if (pRVar7 != (RbNode *)0x0) {
        pRVar20 = pRVar7;
      }
      ((__pthread_internal_list *)((long)this + 0x60))->__next = (__pthread_internal_list *)pRVar20;
    }
    free(ppVar18);
    ppVar18 = *(pthread_mutex_t **)((long)this + 0x50);
    iVar12 = rbAssert((asmjit *)&ppVar18->__data,root);
    if (0 < iVar12) goto LAB_00118ba9;
  }
  release();
  if (root == (RbNode *)0x0) {
    return 0;
  }
  if (extraout_RDX == 0) {
    EVar13 = release((VMemMgr *)&ppVar18->__data,root);
    return EVar13;
  }
  pthread_mutex_lock(ppVar18);
  puVar24 = (undefined8 *)ppVar18[2].__align;
  do {
    if (puVar24 == (undefined8 *)0x0) {
      puVar24 = (undefined8 *)0x0;
      break;
    }
    if (root < (RbNode *)puVar24[2]) {
LAB_00118c1e:
      puVar24 = (undefined8 *)*puVar24;
      bVar32 = true;
    }
    else {
      if ((RbNode *)((long)((RbNode *)puVar24[2])->node + puVar24[6]) <= root) {
        puVar24 = puVar24 + 1;
        goto LAB_00118c1e;
      }
      bVar32 = false;
    }
  } while (bVar32);
  if (puVar24 == (undefined8 *)0x0) {
    EVar13 = 3;
  }
  else {
    uVar21 = puVar24[9];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar21;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (long)root - puVar24[2];
    uVar16 = SUB168(auVar11 / auVar9,0);
    uVar17 = 1L << (SUB161(auVar11 / auVar9,0) & 0x3f);
    uVar28 = uVar16 >> 6;
    uVar14 = *(ulong *)(puVar24[0xc] + uVar28 * 8);
    uVar21 = ((extraout_RDX + uVar21) - 1) / uVar21;
    EVar13 = 0;
    if ((uVar14 >> (uVar16 & 0x3f) & 1) != 0) {
      puVar22 = (ulong *)(puVar24[0xc] + uVar28 * 8);
      puVar23 = (ulong *)(puVar24[0xb] + uVar28 * 8);
      uVar16 = *puVar23;
      do {
        uVar21 = uVar21 - 1;
        if (uVar21 == 0) {
          lVar25 = 0;
          bVar32 = false;
          goto LAB_00118cd3;
        }
        uVar17 = uVar17 * 2;
        if (uVar17 == 0) {
          uVar16 = puVar23[1];
          puVar23 = puVar23 + 1;
          uVar14 = puVar22[1];
          puVar22 = puVar22 + 1;
          uVar17 = 1;
        }
        EVar13 = 0;
      } while ((uVar17 & uVar14) != 0);
    }
  }
LAB_00118d3f:
  pthread_mutex_unlock(ppVar18);
  return EVar13;
}

Assistant:

Error VMemMgr::release(void* p) noexcept {
  if (!p) return kErrorOk;

  AutoLock locked(_lock);
  MemNode* node = vMemMgrFindNodeByPtr(this, static_cast<uint8_t*>(p));
  if (!node) return DebugUtils::errored(kErrorInvalidArgument);

  size_t offset = (size_t)((uint8_t*)p - (uint8_t*)node->mem);
  size_t bitpos = M_DIV(offset, node->density);
  size_t i = (bitpos / kBitsPerEntity);

  size_t* up = node->baUsed + i;  // Current ubits address.
  size_t* cp = node->baCont + i;  // Current cbits address.
  size_t ubits = *up;             // Current ubits[0] value.
  size_t cbits = *cp;             // Current cbits[0] value.
  size_t bit = (size_t)1 << (bitpos % kBitsPerEntity);

  size_t cont = 0;
  bool stop;

  for (;;) {
    stop = (cbits & bit) == 0;
    ubits &= ~bit;
    cbits &= ~bit;

    bit <<= 1;
    cont++;

    if (stop || bit == 0) {
      *up = ubits;
      *cp = cbits;
      if (stop)
        break;

      ubits = *++up;
      cbits = *++cp;
      bit = 1;
    }
  }

  // If the freed block is fully allocated node then it's needed to
  // update 'optimal' pointer in memory manager.
  if (node->used == node->size) {
    MemNode* cur = _optimal;

    do {
      cur = cur->prev;
      if (cur == node) {
        _optimal = node;
        break;
      }
    } while (cur);
  }

  // Statistics.
  cont *= node->density;
  if (node->largestBlock < cont)
    node->largestBlock = cont;

  node->used -= cont;
  _usedBytes -= cont;

  // If page is empty, we can free it.
  if (node->used == 0) {
    // Free memory associated with node (this memory is not accessed
    // anymore so it's safe).
    vMemMgrReleaseVMem(this, node->mem, node->size);
    Internal::releaseMemory(node->baUsed);

    node->baUsed = nullptr;
    node->baCont = nullptr;

    // Statistics.
    _allocatedBytes -= node->size;

    // Remove node. This function can return different node than
    // passed into, but data is copied into previous node if needed.
    Internal::releaseMemory(vMemMgrRemoveNode(this, node));
    ASMJIT_ASSERT(vMemMgrCheckTree(this));
  }

  return kErrorOk;
}